

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeToggledCase::setupTest(DecodeToggledCase *this)

{
  char *pcVar1;
  Vec4 local_294;
  Vec4 local_284;
  allocator<char> local_271;
  value_type local_270;
  undefined1 local_250 [8];
  FragmentShaderParameters shaderParametersB;
  FragmentShaderParameters shaderParametersA;
  string local_148;
  allocator<char> local_121;
  string local_120;
  undefined1 local_100 [8];
  ComparisonFunction colorsEqualFunction;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  ComparisonFunction srgbToLinearFunction;
  DecodeToggledCase *this_local;
  
  srgbToLinearFunction.implementation.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"srgbToLinearCheck",&local_79);
  pcVar1 = getFunctionDefinitionSRGBToLinearCheck();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,pcVar1,
             (allocator<char> *)(colorsEqualFunction.implementation.field_2._M_local_buf + 0xf));
  ComparisonFunction::ComparisonFunction
            ((ComparisonFunction *)local_58,&local_78,FUNCTIONPARAMETERS_TWO,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(colorsEqualFunction.implementation.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"colorsEqualCheck",&local_121);
  pcVar1 = getFunctionDefinitionEqualCheck();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,pcVar1,
             (allocator<char> *)
             ((long)&shaderParametersA.uniformsToToggle.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ComparisonFunction::ComparisonFunction
            ((ComparisonFunction *)local_100,&local_120,FUNCTIONPARAMETERS_TWO,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&shaderParametersA.uniformsToToggle.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  FragmentShaderParameters::FragmentShaderParameters
            ((FragmentShaderParameters *)
             &shaderParametersB.uniformsToToggle.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,SHADEROUTPUTS_ONE,
             SHADERUNIFORMS_TWO,(ComparisonFunction *)local_58,BLENDING_NOT_REQUIRED,
             TOGGLING_NOT_REQUIRED);
  FragmentShaderParameters::FragmentShaderParameters
            ((FragmentShaderParameters *)local_250,SHADEROUTPUTS_ONE,SHADERUNIFORMS_TWO,
             (ComparisonFunction *)local_100,BLENDING_REQUIRED,TOGGLING_REQUIRED);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"uTexture0",&local_271);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&shaderParametersB.toggleRequired,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  getColorReferenceLinear();
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,TEXTURETYPE_2D,0x80,0x80,&local_284,MIRRORED_REPEAT_GL,
             MIRRORED_REPEAT_GL,LINEAR,LINEAR,SRGBDECODE_SKIP_DECODE);
  getColorReferenceLinear();
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,TEXTURETYPE_2D,0x80,0x80,&local_294,MIRRORED_REPEAT_GL,
             MIRRORED_REPEAT_GL,LINEAR,LINEAR,SRGBDECODE_DECODE);
  SRGBTestCase::addShaderProgram
            (&this->super_SRGBTestCase,
             (FragmentShaderParameters *)
             &shaderParametersB.uniformsToToggle.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  SRGBTestCase::addShaderProgram(&this->super_SRGBTestCase,(FragmentShaderParameters *)local_250);
  SRGBTestCase::setSamplingLocations(&this->super_SRGBTestCase,0,0);
  SRGBTestCase::setSamplingGroup(&this->super_SRGBTestCase,SHADERSAMPLINGGROUP_TEXTURE);
  FragmentShaderParameters::~FragmentShaderParameters((FragmentShaderParameters *)local_250);
  FragmentShaderParameters::~FragmentShaderParameters
            ((FragmentShaderParameters *)
             &shaderParametersB.uniformsToToggle.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ComparisonFunction::~ComparisonFunction((ComparisonFunction *)local_100);
  ComparisonFunction::~ComparisonFunction((ComparisonFunction *)local_58);
  return;
}

Assistant:

void DecodeToggledCase::setupTest (void)
{
	// TEST STEPS:
	//	- create and set texture_a to DECODE_SKIP_EXT and texture_b to DECODE_EXT
	//	- create and use two seperate shader programs, program_a and program_b, each using different fragment shaders
	//	- store texture_a and texture_b on GPU
	// FIRST PASS:
	//	- use program_a
	//	- in fragment shader, sample both textures using texture*() and manually perform sRGB to lRGB conversion on texture_a
	//	- in fragment shader, test converted texture_a value with texture_b
	//	- render green image for pass or red for fail
	//	- store result in a color attachement 0
	// TOGGLE STAGE
	//	- during rendering, toggle texture_a from DECODE_SKIP_EXT to DECODE_EXT
	// SECOND PASS:
	//	- use program_b
	//	- in fragment shader, sample both textures using texture*() and manually perform equality check. Both should be linear
	//	- blend first pass result with second pass. Anything but a green result equals fail

	ComparisonFunction srgbToLinearFunction("srgbToLinearCheck", FUNCTIONPARAMETERS_TWO, getFunctionDefinitionSRGBToLinearCheck());
	ComparisonFunction colorsEqualFunction("colorsEqualCheck", FUNCTIONPARAMETERS_TWO, getFunctionDefinitionEqualCheck());

	FragmentShaderParameters shaderParametersA(SHADEROUTPUTS_ONE, SHADERUNIFORMS_TWO, &srgbToLinearFunction, BLENDING_NOT_REQUIRED, TOGGLING_NOT_REQUIRED);
	FragmentShaderParameters shaderParametersB(SHADEROUTPUTS_ONE, SHADERUNIFORMS_TWO, &colorsEqualFunction, BLENDING_REQUIRED, TOGGLING_REQUIRED);

	// need to specify which texture uniform to toggle DECODE_EXT/SKIP_DECODE_EXT
	shaderParametersB.uniformsToToggle.push_back("uTexture0");

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_SKIP_DECODE);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_DECODE);

	this->addShaderProgram(shaderParametersA);
	this->addShaderProgram(shaderParametersB);

	this->setSamplingLocations(TestSamplingPositions::X_POS, TestSamplingPositions::Y_POS);
	this->setSamplingGroup(SHADERSAMPLINGGROUP_TEXTURE);
}